

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree234.c
# Opt level: O0

int main(int argc,char **argv)

{
  char *__s1;
  int iVar1;
  uint uVar2;
  char *arg;
  uint seed;
  int k;
  int j;
  int i;
  int in [60];
  char **argv_local;
  int argc_local;
  
  arg._0_4_ = 0;
  k = 1;
  in._232_8_ = argv;
  while( true ) {
    if (argc <= k) {
      for (k = 0; (uint)k < 0x3c; k = k + 1) {
        (&j)[k] = 0;
      }
      array = (void **)0x0;
      arraysize = 0;
      arraylen = 0;
      tree = newtree234(mycmp);
      cmp = mycmp;
      verify();
      searchtest();
      for (k = 0; k < 10000; k = k + 1) {
        iVar1 = randomnumber((uint *)&arg);
        seed = (uint)((ulong)(long)iVar1 % 0x3c);
        if (verbose != 0) {
          printf("trial: %d\n",(ulong)(uint)k);
        }
        if ((&j)[(int)seed] == 0) {
          if (verbose != 0) {
            printf("adding %s (%d)\n",strings[(int)seed],(ulong)seed);
          }
          addtest(strings[(int)seed]);
          (&j)[(int)seed] = 1;
        }
        else {
          if (verbose != 0) {
            printf("deleting %s (%d)\n",strings[(int)seed],(ulong)seed);
          }
          deltest(strings[(int)seed]);
          (&j)[(int)seed] = 0;
        }
        findtest();
        searchtest();
      }
      while (0 < arraylen) {
        iVar1 = randomnumber((uint *)&arg);
        seed = iVar1 % arraylen;
        deltest(array[(int)seed]);
      }
      freetree234(tree);
      tree = newtree234((cmpfn234)0x0);
      cmp = (cmpfn234)0x0;
      verify();
      for (k = 0; k < 1000; k = k + 1) {
        if (verbose != 0) {
          printf("trial: %d\n",(ulong)(uint)k);
        }
        iVar1 = randomnumber((uint *)&arg);
        seed = (uint)((ulong)(long)iVar1 % 0x3c);
        arg._4_4_ = randomnumber((uint *)&arg);
        iVar1 = count234(tree);
        arg._4_4_ = (int)arg._4_4_ % (iVar1 + 1);
        if (verbose != 0) {
          printf("adding string %s at index %d\n",strings[(int)seed],(ulong)arg._4_4_);
        }
        addpostest(strings[(int)seed],arg._4_4_);
      }
      while (iVar1 = count234(tree), 0 < iVar1) {
        if (verbose != 0) {
          uVar2 = count234(tree);
          printf("cleanup: tree size %d\n",(ulong)uVar2);
        }
        seed = randomnumber((uint *)&arg);
        iVar1 = count234(tree);
        seed = (int)seed % iVar1;
        if (verbose != 0) {
          printf("deleting string %s from index %d\n",array[(int)seed],(ulong)seed);
        }
        delpostest(seed);
      }
      printf("%d errors found\n",(ulong)(uint)n_errors);
      return (uint)(n_errors != 0);
    }
    __s1 = *(char **)(in._232_8_ + (long)k * 8);
    iVar1 = strcmp(__s1,"-v");
    if (iVar1 != 0) break;
    verbose = verbose + 1;
    k = k + 1;
  }
  fprintf(_stderr,"unrecognised option \'%s\'\n",__s1);
  return 1;
}

Assistant:

int main(int argc, char **argv)
{
    int in[NSTR];
    int i, j, k;
    unsigned seed = 0;

    for (i = 1; i < argc; i++) {
        char *arg = argv[i];
        if (!strcmp(arg, "-v")) {
            verbose++;
        } else {
            fprintf(stderr, "unrecognised option '%s'\n", arg);
            return 1;
        }
    }

    for (i = 0; i < NSTR; i++)
        in[i] = 0;
    array = NULL;
    arraylen = arraysize = 0;
    tree = newtree234(mycmp);
    cmp = mycmp;

    verify();
    searchtest();
    for (i = 0; i < 10000; i++) {
        j = randomnumber(&seed);
        j %= NSTR;
        if (verbose)
            printf("trial: %d\n", i);
        if (in[j]) {
            if (verbose)
                printf("deleting %s (%d)\n", strings[j], j);
            deltest(strings[j]);
            in[j] = 0;
        } else {
            if (verbose)
                printf("adding %s (%d)\n", strings[j], j);
            addtest(strings[j]);
            in[j] = 1;
        }
        findtest();
        searchtest();
    }

    while (arraylen > 0) {
        j = randomnumber(&seed);
        j %= arraylen;
        deltest(array[j]);
    }

    freetree234(tree);

    /*
     * Now try an unsorted tree. We don't really need to test
     * delpos234 because we know del234 is based on it, so it's
     * already been tested in the above sorted-tree code; but for
     * completeness we'll use it to tear down our unsorted tree
     * once we've built it.
     */
    tree = newtree234(NULL);
    cmp = NULL;
    verify();
    for (i = 0; i < 1000; i++) {
        if (verbose)
            printf("trial: %d\n", i);
        j = randomnumber(&seed);
        j %= NSTR;
        k = randomnumber(&seed);
        k %= count234(tree) + 1;
        if (verbose)
            printf("adding string %s at index %d\n", strings[j], k);
        addpostest(strings[j], k);
    }
    while (count234(tree) > 0) {
        if (verbose)
            printf("cleanup: tree size %d\n", count234(tree));
        j = randomnumber(&seed);
        j %= count234(tree);
        if (verbose)
            printf("deleting string %s from index %d\n",
                   (const char *)array[j], j);
        delpostest(j);
    }

    printf("%d errors found\n", n_errors);
    return (n_errors != 0);
}